

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::AverageTestBase<unsigned_char>::SetUp
          (AverageTestBase<unsigned_char> *this)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  ACMRandom *this_00;
  long in_RDI;
  AssertionResult gtest_ar;
  TestInfo *test_info;
  int in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  uchar **in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 uVar5;
  UnitTest *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Type type;
  undefined7 in_stack_ffffffffffffff30;
  byte bVar6;
  byte bVar7;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [32];
  TestInfo *local_10;
  
  type = (Type)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  testing::UnitTest::GetInstance();
  local_10 = testing::UnitTest::current_test_info(in_stack_ffffffffffffff20);
  pcVar2 = testing::TestInfo::test_suite_name((TestInfo *)0xa3cb7e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  lVar3 = std::__cxx11::string::find((char *)local_30,0x1960d01);
  bVar6 = 0;
  bVar7 = bVar6;
  if (lVar3 == 0) {
    pcVar2 = testing::TestInfo::name((TestInfo *)0xa3cbf2);
    in_stack_ffffffffffffff20 = (UnitTest *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),pcVar2,(allocator *)in_stack_ffffffffffffff20);
    type = (Type)((ulong)pcVar2 >> 0x20);
    lVar3 = std::__cxx11::string::find(local_69 + 1,0x1882237);
    bVar6 = lVar3 != -1;
    bVar7 = bVar6;
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar6 & 1) == 0) {
    pvVar4 = aom_memalign(CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff1e,
                                                  CONCAT24(in_stack_ffffffffffffff1c,
                                                           in_stack_ffffffffffffff18))),
                          (size_t)in_stack_ffffffffffffff10);
    *(void **)(in_RDI + 0x18) = pvVar4;
    this_01 = (AssertionResult *)&stack0xffffffffffffff70;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((char *)CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff1e,
                                               CONCAT24(in_stack_ffffffffffffff1c,
                                                        in_stack_ffffffffffffff18))),(char *)this_01
               ,in_stack_ffffffffffffff08,&in_stack_ffffffffffffff00->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!bVar1) {
      uVar5 = bVar1;
      testing::Message::Message((Message *)CONCAT17(bVar7,in_stack_ffffffffffffff30));
      testing::AssertionResult::failure_message((AssertionResult *)0xa3ce80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(bVar7,in_stack_ffffffffffffff30),type,
                 (char *)in_stack_ffffffffffffff20,
                 CONCAT13(bVar6,CONCAT12(uVar5,in_stack_ffffffffffffff1c)),&this_01->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
      testing::Message::~Message((Message *)0xa3cece);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xa3cf2a);
    if (bVar1) {
      memset(*(void **)(in_RDI + 0x18),0,0x4000);
      *(uint *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x10) + 0x1fU & 0xffffffe0;
      *(undefined4 *)(in_RDI + 0x24) = 8;
      this_00 = (ACMRandom *)(in_RDI + 0x28);
      libaom_test::ACMRandom::DeterministicSeed();
      libaom_test::ACMRandom::Reset(this_00,in_stack_fffffffffffffefc);
    }
  }
  else {
    testing::Message::Message((Message *)CONCAT17(bVar7,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(bVar7,in_stack_ffffffffffffff30),type,
               (char *)in_stack_ffffffffffffff20,
               CONCAT13(bVar6,CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)),
               in_stack_ffffffffffffff10);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0xa3cd1d);
  }
  return;
}

Assistant:

void SetUp() override {
    const testing::TestInfo *const test_info =
        testing::UnitTest::GetInstance()->current_test_info();
    // Skip the speed test for C code as the baseline uses the same function.
    if (std::string(test_info->test_suite_name()).find("C/") == 0 &&
        std::string(test_info->name()).find("DISABLED_Speed") !=
            std::string::npos) {
      GTEST_SKIP();
    }

    source_data_ = static_cast<Pixel *>(
        aom_memalign(kDataAlignment, kDataBlockSize * sizeof(source_data_[0])));
    ASSERT_NE(source_data_, nullptr);
    memset(source_data_, 0, kDataBlockSize * sizeof(source_data_[0]));
    source_stride_ = (width_ + 31) & ~31;
    bit_depth_ = 8;
    rnd_.Reset(ACMRandom::DeterministicSeed());
  }